

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_log_unregister_callback(ma_log *pLog,ma_log_callback callback)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ma_log_callback *pmVar4;
  ma_log_callback *pmVar5;
  ulong uVar6;
  
  if (pLog == (ma_log *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar3 = (ulong)pLog->callbackCount;
  uVar1 = 0;
  do {
    uVar1 = uVar1 & 0xffffffff;
    pmVar5 = pLog->callbacks + uVar1;
    pmVar4 = pLog->callbacks + uVar1 + 1;
    while( true ) {
      if ((uint)uVar3 <= (uint)uVar1) {
        return MA_SUCCESS;
      }
      uVar6 = uVar1;
      if (pmVar5->onLog == callback.onLog) break;
      uVar1 = uVar1 + 1;
      pmVar5 = pmVar5 + 1;
      pmVar4 = pmVar4 + 1;
    }
    while( true ) {
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
      if (uVar3 <= uVar6) break;
      pmVar4[-1].onLog = pmVar4->onLog;
      *(void **)((long)(pmVar4 + -1) + 8) = pmVar4->pUserData;
      uVar3 = (ulong)pLog->callbackCount;
      pmVar4 = pmVar4 + 1;
      uVar6 = uVar6 + 1;
    }
    pLog->callbackCount = uVar2;
  } while( true );
}

Assistant:

MA_API ma_result ma_log_unregister_callback(ma_log* pLog, ma_log_callback callback)
{
    if (pLog == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; ) {
            if (pLog->callbacks[iLog].onLog == callback.onLog) {
                /* Found. Move everything down a slot. */
                ma_uint32 jLog;
                for (jLog = iLog; jLog < pLog->callbackCount-1; jLog += 1) {
                    pLog->callbacks[jLog] = pLog->callbacks[jLog + 1];
                }

                pLog->callbackCount -= 1;
            } else {
                /* Not found. */
                iLog += 1;
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}